

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofXyz.cpp
# Opt level: O1

void __thiscall OpenMD::GofXyz::initializeHistogram(GofXyz *this)

{
  SelectionManager *this_00;
  undefined4 *puVar1;
  char cVar2;
  double dVar3;
  bool bVar4;
  uint i_1;
  StuntDouble *this_01;
  StuntDouble *pSVar5;
  pair<const_int,_OpenMD::SquareMatrix3<double>_> *ppVar6;
  uint i_3;
  uint i_2;
  pair<const_int,_OpenMD::SquareMatrix3<double>_> *ppVar7;
  double *pdVar8;
  long lVar9;
  SquareMatrix3<double> *pSVar10;
  long lVar11;
  double (*__return_storage_ptr__) [3];
  byte bVar12;
  double tmp;
  Vector<double,_3U> result_2;
  Vector3d zaxis;
  int j;
  int i;
  Vector3<double> result_4;
  MultipoleAdapter ma1;
  Vector<double,_3U> result;
  undefined8 local_198;
  undefined8 uStack_190;
  double local_188;
  undefined8 local_178;
  undefined8 uStack_170;
  double local_168;
  int local_160;
  int local_15c;
  double local_158 [4];
  _Rb_tree<int,std::pair<int_const,OpenMD::SquareMatrix3<double>>,std::_Select1st<std::pair<int_const,OpenMD::SquareMatrix3<double>>>,std::less<int>,std::allocator<std::pair<int_const,OpenMD::SquareMatrix3<double>>>>
  *local_138;
  MultipoleAdapter local_130;
  pair<const_int,_OpenMD::SquareMatrix3<double>_> local_128;
  Vector3d local_d8;
  double local_b8 [4];
  double local_98 [4];
  double local_78;
  double dStack_70;
  double local_68;
  double local_60;
  double dStack_58;
  double local_50;
  double dStack_48;
  double local_40;
  double dStack_38;
  
  bVar12 = 0;
  if ((this->evaluator3_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_128,&this->evaluator3_);
    lVar11 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan3_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar11),
                 (vector<bool,_std::allocator<bool>_> *)(local_128._0_8_ + lVar11));
      lVar11 = lVar11 + 0x28;
    } while (lVar11 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_128);
  }
  cVar2 = (((this->super_RadialDistrFunc).super_StaticAnalyser.info_)->simParams_->
          UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  local_138 = (_Rb_tree<int,std::pair<int_const,OpenMD::SquareMatrix3<double>>,std::_Select1st<std::pair<int_const,OpenMD::SquareMatrix3<double>>>,std::less<int>,std::allocator<std::pair<int_const,OpenMD::SquareMatrix3<double>>>>
               *)&this->rotMats_;
  std::
  _Rb_tree<int,_std::pair<const_int,_OpenMD::SquareMatrix3<double>_>,_std::_Select1st<std::pair<const_int,_OpenMD::SquareMatrix3<double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::SquareMatrix3<double>_>_>_>
  ::clear((_Rb_tree<int,_std::pair<const_int,_OpenMD::SquareMatrix3<double>_>,_std::_Select1st<std::pair<const_int,_OpenMD::SquareMatrix3<double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::SquareMatrix3<double>_>_>_>
           *)local_138);
  this_00 = &(this->super_RadialDistrFunc).seleMan1_;
  this_01 = SelectionManager::beginSelected(this_00,&local_15c);
  pSVar5 = SelectionManager::beginSelected(&this->seleMan3_,&local_160);
  if (pSVar5 != (StuntDouble *)0x0 || this_01 != (StuntDouble *)0x0) {
    do {
      lVar11 = *(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).position.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + pSVar5->storage_);
      local_98[2] = (double)*(undefined8 *)(lVar11 + 0x10 + (long)pSVar5->localIndex_ * 0x18);
      pdVar8 = (double *)(lVar11 + (long)pSVar5->localIndex_ * 0x18);
      local_98[0] = *pdVar8;
      local_98[1] = pdVar8[1];
      lVar11 = *(long *)((long)&(this_01->snapshotMan_->currentSnapshot_->atomData).position.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + this_01->storage_);
      local_b8[2] = (double)*(undefined8 *)(lVar11 + 0x10 + (long)this_01->localIndex_ * 0x18);
      pdVar8 = (double *)(lVar11 + (long)this_01->localIndex_ * 0x18);
      local_b8[0] = *pdVar8;
      local_b8[1] = pdVar8[1];
      local_128._0_8_ = 0.0;
      local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           0.0;
      local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] =
           0.0;
      lVar11 = 0;
      do {
        *(double *)
         ((long)(local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                 data_ + -1) + 0x10U + lVar11 * 8) = local_98[lVar11] - local_b8[lVar11];
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      local_d8.super_Vector<double,_3U>.data_[2] =
           local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
           [1];
      local_d8.super_Vector<double,_3U>.data_[0] = (double)local_128._0_8_;
      local_d8.super_Vector<double,_3U>.data_[1] =
           local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
           [0];
      if (cVar2 != '\0') {
        Snapshot::wrapVector
                  (((this->super_RadialDistrFunc).super_StaticAnalyser.info_)->sman_->
                   currentSnapshot_,&local_d8);
      }
      local_130.at_ = (AtomType *)this_01[1]._vptr_StuntDouble;
      local_178 = 0.0;
      uStack_170 = 0.0;
      local_168 = 0.0;
      bVar4 = MultipoleAdapter::isDipole(&local_130);
      if (bVar4) {
        lVar11 = *(long *)((long)&(this_01->snapshotMan_->currentSnapshot_->atomData).dipole.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + this_01->storage_);
        local_168 = *(double *)(lVar11 + 0x10 + (long)this_01->localIndex_ * 0x18);
        puVar1 = (undefined4 *)(lVar11 + (long)this_01->localIndex_ * 0x18);
        local_198._0_4_ = *puVar1;
        local_198._4_4_ = puVar1[1];
        uStack_190._0_4_ = puVar1[2];
        uStack_190._4_4_ = puVar1[3];
      }
      else {
        __return_storage_ptr__ = (double (*) [3])&local_78;
        StuntDouble::getA((RotMat3x3d *)__return_storage_ptr__,this_01);
        local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2]
             = 0.0;
        local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0]
             = 0.0;
        local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0]
             = 0.0;
        local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1]
             = 0.0;
        local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1]
             = 0.0;
        local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2]
             = 0.0;
        local_128._0_8_ = 0.0;
        local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
             = 0.0;
        local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1]
             = 0.0;
        ppVar6 = &local_128;
        lVar11 = 0;
        do {
          lVar9 = 0;
          ppVar7 = ppVar6;
          do {
            *(double *)ppVar7 =
                 (((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                 super_RectMatrix<double,_3U,_3U>).data_[0][lVar9];
            lVar9 = lVar9 + 1;
            ppVar7 = (pair<const_int,_OpenMD::SquareMatrix3<double>_> *)
                     ((ppVar7->second).super_SquareMatrix<double,_3>.
                      super_RectMatrix<double,_3U,_3U>.data_[0] + 2);
          } while (lVar9 != 3);
          lVar11 = lVar11 + 1;
          ppVar6 = (pair<const_int,_OpenMD::SquareMatrix3<double>_> *)&ppVar6->second;
          __return_storage_ptr__ = __return_storage_ptr__ + 1;
        } while (lVar11 != 3);
        local_198 = 0.0;
        uStack_190 = 0.0;
        local_188 = 0.0;
        ppVar6 = &local_128;
        lVar11 = 0;
        do {
          dVar3 = (double)(&local_198)[lVar11];
          lVar9 = 0;
          do {
            dVar3 = dVar3 + *(double *)
                             ((long)((ppVar6->second).super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_ + -1) + 0x10U + lVar9) *
                            *(double *)((long)&OpenMD::V3Z + lVar9);
            lVar9 = lVar9 + 8;
          } while (lVar9 != 0x18);
          (&local_198)[lVar11] = dVar3;
          lVar11 = lVar11 + 1;
          ppVar6 = (pair<const_int,_OpenMD::SquareMatrix3<double>_> *)
                   ((ppVar6->second).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                    data_[0] + 2);
        } while (lVar11 != 3);
        local_168 = local_188;
      }
      local_178 = (double)CONCAT44(local_198._4_4_,(undefined4)local_198);
      uStack_170 = (double)CONCAT44(uStack_190._4_4_,(undefined4)uStack_190);
      local_198 = local_d8.super_Vector<double,_3U>.data_[1] * local_168 -
                  local_d8.super_Vector<double,_3U>.data_[2] * uStack_170;
      uStack_190 = local_d8.super_Vector<double,_3U>.data_[2] * local_178 -
                   local_d8.super_Vector<double,_3U>.data_[0] * local_168;
      local_188 = local_d8.super_Vector<double,_3U>.data_[0] * uStack_170 -
                  local_178 * local_d8.super_Vector<double,_3U>.data_[1];
      local_158[0] = local_188 * uStack_170 - uStack_190 * local_168;
      local_158[1] = local_198 * local_168 - local_188 * local_178;
      local_158[2] = uStack_190 * local_178 - local_198 * uStack_170;
      dVar3 = 0.0;
      lVar11 = 0;
      do {
        dVar3 = dVar3 + (double)(&local_198)[lVar11] * (double)(&local_198)[lVar11];
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      lVar11 = 0;
      do {
        (&local_198)[lVar11] = (double)(&local_198)[lVar11] / dVar3;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      dVar3 = 0.0;
      lVar11 = 0;
      do {
        dVar3 = dVar3 + local_158[lVar11] * local_158[lVar11];
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      lVar11 = 0;
      do {
        local_158[lVar11] = local_158[lVar11] / dVar3;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      dVar3 = 0.0;
      lVar11 = 0;
      do {
        dVar3 = dVar3 + (double)(&local_178)[lVar11] * (double)(&local_178)[lVar11];
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      lVar11 = 0;
      do {
        (&local_178)[lVar11] = (double)(&local_178)[lVar11] / dVar3;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      local_68 = local_188;
      local_78 = local_198;
      dStack_70 = uStack_190;
      local_50 = local_158[2];
      local_60 = local_158[0];
      dStack_58 = local_158[1];
      dStack_38 = local_168;
      dStack_48 = local_178;
      local_40 = uStack_170;
      local_128.first = this_01->globalIndex_;
      pdVar8 = &local_78;
      pSVar10 = &local_128.second;
      for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pSVar10->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0] =
             *pdVar8;
        pdVar8 = pdVar8 + (ulong)bVar12 * -2 + 1;
        pSVar10 = (SquareMatrix3<double> *)((long)pSVar10 + ((ulong)bVar12 * -2 + 1) * 8);
      }
      std::
      _Rb_tree<int,std::pair<int_const,OpenMD::SquareMatrix3<double>>,std::_Select1st<std::pair<int_const,OpenMD::SquareMatrix3<double>>>,std::less<int>,std::allocator<std::pair<int_const,OpenMD::SquareMatrix3<double>>>>
      ::_M_insert_unique<std::pair<int_const,OpenMD::SquareMatrix3<double>>>(local_138,&local_128);
      this_01 = SelectionManager::nextSelected(this_00,&local_15c);
      pSVar5 = SelectionManager::nextSelected(&this->seleMan3_,&local_160);
    } while (pSVar5 != (StuntDouble *)0x0 || this_01 != (StuntDouble *)0x0);
  }
  return;
}

Assistant:

void GofXyz::initializeHistogram() {
    // Calculate the center of mass of the molecule of selected
    // StuntDouble in selection1

    if (!evaluator3_.isDynamic()) {
      seleMan3_.setSelectionSet(evaluator3_.evaluate());
    }

    assert(seleMan1_.getSelectionCount() == seleMan3_.getSelectionCount());
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    // The Dipole direction of selection3 and position of selection3 will
    // be used to determine the y-z plane
    // v1 = s3 -s1,
    // z = origin.dipole
    // x = v1 X z
    // y = z X x
    rotMats_.clear();

    int i;
    int j;
    StuntDouble* sd1;
    StuntDouble* sd3;

    for (sd1 = seleMan1_.beginSelected(i), sd3 = seleMan3_.beginSelected(j);
         sd1 != NULL || sd3 != NULL;
         sd1 = seleMan1_.nextSelected(i), sd3 = seleMan3_.nextSelected(j)) {
      Vector3d r3 = sd3->getPos();
      Vector3d r1 = sd1->getPos();
      Vector3d v1 = r3 - r1;
      if (usePeriodicBoundaryConditions_)
        info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(v1);

      AtomType* atype1     = static_cast<Atom*>(sd1)->getAtomType();
      MultipoleAdapter ma1 = MultipoleAdapter(atype1);

      Vector3d zaxis;
      if (ma1.isDipole())
        zaxis = sd1->getDipole();
      else
        zaxis = sd1->getA().transpose() * V3Z;

      Vector3d xaxis = cross(v1, zaxis);
      Vector3d yaxis = cross(zaxis, xaxis);

      xaxis.normalize();
      yaxis.normalize();
      zaxis.normalize();

      RotMat3x3d rotMat;
      rotMat.setRow(0, xaxis);
      rotMat.setRow(1, yaxis);
      rotMat.setRow(2, zaxis);

      rotMats_.insert(
          std::map<int, RotMat3x3d>::value_type(sd1->getGlobalIndex(), rotMat));
    }
  }